

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

FSerializer * Serialize(FSerializer *arc,char *key,NumericValue *value,NumericValue *defval)

{
  ushort uVar1;
  uint uVar2;
  EType EVar3;
  FWriter *pFVar4;
  anon_union_8_3_1b0c0a0a_for_NumericValue_2 *this;
  double dVar5;
  
  pFVar4 = arc->w;
  if (pFVar4 == (FWriter *)0x0) {
    this = (anon_union_8_3_1b0c0a0a_for_NumericValue_2 *)FReader::FindKey(arc->r,key);
    (value->field_1).signedval = 0;
    value->type = NM_invalid;
    if (this != (anon_union_8_3_1b0c0a0a_for_NumericValue_2 *)0x0) {
      uVar1 = *(ushort *)((long)this + 0x16);
      if ((uVar1 >> 8 & 1) == 0) {
        if ((char)uVar1 < '\0') {
          value->field_1 = *this;
          value->type = NM_signed;
        }
        else if ((uVar1 >> 9 & 1) != 0) {
          dVar5 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetDouble((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)this);
          (value->field_1).floatval = dVar5;
          value->type = NM_float;
        }
      }
      else {
        value->field_1 = *this;
        value->type = NM_unsigned;
      }
    }
  }
  else {
    uVar2 = (pFVar4->mInObject).Count;
    if ((((uVar2 == 0) || (defval == (NumericValue *)0x0)) ||
        ((pFVar4->mInObject).Array[uVar2 - 1] == false)) ||
       ((value->type != defval->type || ((value->field_1).signedval != (defval->field_1).signedval))
       )) {
      FSerializer::WriteKey(arc,key);
      EVar3 = value->type;
      pFVar4 = arc->w;
      if (EVar3 == NM_float) {
        FWriter::Double(pFVar4,(value->field_1).floatval);
      }
      else if (EVar3 == NM_unsigned) {
        FWriter::Uint64(pFVar4,(value->field_1).signedval);
      }
      else if (EVar3 == NM_signed) {
        FWriter::Int64(pFVar4,(value->field_1).signedval);
      }
      else {
        FWriter::Null(pFVar4);
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, NumericValue &value, NumericValue *defval)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || defval == nullptr || value != *defval)
		{
			arc.WriteKey(key);
			switch (value.type)
			{
			case NumericValue::NM_signed:
				arc.w->Int64(value.signedval);
				break;
			case NumericValue::NM_unsigned:
				arc.w->Uint64(value.unsignedval);
				break;
			case NumericValue::NM_float:
				arc.w->Double(value.floatval);
				break;
			default:
				arc.w->Null();
				break;
			}
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		value.signedval = 0;
		value.type = NumericValue::NM_invalid;
		if (val != nullptr)
		{
			if (val->IsUint64())
			{
				value.unsignedval = val->GetUint64();
				value.type = NumericValue::NM_unsigned;
			}
			else if (val->IsInt64())
			{
				value.signedval = val->GetInt64();
				value.type = NumericValue::NM_signed;
			}
			else if (val->IsDouble())
			{
				value.floatval = val->GetDouble();
				value.type = NumericValue::NM_float;
			}
		}
	}
	return arc;
}